

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_29b9341::OpCodeParser::OpCodeParser(OpCodeParser *this)

{
  int iVar1;
  mapped_type *pmVar2;
  opcodetype opcode;
  long in_FS_OFFSET;
  string strName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._8_4_ = 0;
  opcode = OP_0;
  (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._16_8_ = 0;
  (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._24_8_ = 0xb12058;
  (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._32_8_ = 0xb12058;
  (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._40_8_ = 0;
  do {
    if (OP_16 < opcode || opcode == OP_RESERVED) {
      GetOpName_abi_cxx11_(&local_58,opcode);
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_58,"OP_UNKNOWN");
      if (iVar1 != 0) {
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                               *)(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::
                                 ocp,&local_58);
        *pmVar2 = opcode;
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_58,0,3,"OP_");
        if (iVar1 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_78,&local_58,3,0xffffffffffffffff);
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                                 *)(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::
                                   ocp,&local_78);
          *pmVar2 = opcode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    opcode = opcode + 1;
  } while (opcode != OP_CHECKSIGADD);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

OpCodeParser()
    {
        for (unsigned int op = 0; op <= MAX_OPCODE; ++op) {
            // Allow OP_RESERVED to get into mapOpNames
            if (op < OP_NOP && op != OP_RESERVED) {
                continue;
            }

            std::string strName = GetOpName(static_cast<opcodetype>(op));
            if (strName == "OP_UNKNOWN") {
                continue;
            }
            mapOpNames[strName] = static_cast<opcodetype>(op);
            // Convenience: OP_ADD and just ADD are both recognized:
            if (strName.compare(0, 3, "OP_") == 0) { // strName starts with "OP_"
                mapOpNames[strName.substr(3)] = static_cast<opcodetype>(op);
            }
        }
    }